

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O1

bool __thiscall cmCTestSubmitCommand::CheckArgumentValue(cmCTestSubmitCommand *this,string *arg)

{
  cmMakefile *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  Part p;
  ostringstream e;
  Part local_1b4;
  string local_1b0;
  undefined1 local_190 [376];
  
  switch((this->super_cmCTestHandlerCommand).ArgumentDoing) {
  case 3:
    local_1b4 = cmCTest::GetPartFromName
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                           (arg->_M_dataplus)._M_p);
    if (local_1b4 != PartCount) {
      std::
      _Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
      ::_M_insert_unique<cmCTest::Part_const&>
                ((_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
                  *)&this->Parts,&local_1b4);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Part name \"",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(arg->_M_dataplus)._M_p,arg->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" is invalid.",0xd);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b0);
    goto LAB_0019f27b;
  case 4:
    bVar2 = cmsys::SystemTools::FileExists(arg);
    if (bVar2) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->Files,arg);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"File \"",6);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(arg->_M_dataplus)._M_p,arg->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"\" does not exist. Cannot submit ",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a non-existent file.",0x14);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b0);
LAB_0019f27b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
    return true;
  case 5:
    psVar4 = (string *)&this->RetryDelay;
    break;
  case 6:
    psVar4 = (string *)&this->RetryCount;
    break;
  case 7:
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    psVar4 = (string *)&this->CDashUploadFile;
    break;
  case 8:
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    psVar4 = (string *)&this->CDashUploadType;
    break;
  case 9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->HttpHeaders,arg);
    return true;
  case 10:
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    psVar4 = (string *)&this->SubmitURL;
    break;
  default:
    bVar2 = cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
    return bVar2;
  }
  std::__cxx11::string::_M_assign(psVar4);
  return true;
}

Assistant:

bool cmCTestSubmitCommand::CheckArgumentValue(std::string const& arg)
{
  // Handle states specific to this command.
  if (this->ArgumentDoing == ArgumentDoingParts) {
    cmCTest::Part p = this->CTest->GetPartFromName(arg.c_str());
    if (p != cmCTest::PartCount) {
      this->Parts.insert(p);
    } else {
      std::ostringstream e;
      e << "Part name \"" << arg << "\" is invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
    }
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingFiles) {
    if (cmSystemTools::FileExists(arg)) {
      this->Files.insert(arg);
    } else {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
    }
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingHttpHeader) {
    this->HttpHeaders.push_back(arg);
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingRetryCount) {
    this->RetryCount = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingRetryDelay) {
    this->RetryDelay = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingCDashUpload) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->CDashUploadFile = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingCDashUploadType) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->CDashUploadType = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingSubmitURL) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->SubmitURL = arg;
    return true;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}